

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSynchWaitController::RegisterWaitingThread
          (CSynchWaitController *this,WaitType wtWaitType,DWORD dwIndex,bool fAlertable)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  PalObjectTypeId PVar4;
  uint uVar5;
  LONG LVar6;
  CPalSynchronizationManager *this_00;
  CPalThread *pCVar7;
  ThreadWaitInfo *ptwiWaitInfo_00;
  LONG *Destination;
  SIZE_T SVar8;
  SHMPTR SVar9;
  CProcProcessLocalData *pProcLocalData_00;
  bool fHaveSharedLock;
  LONG lSharedSynchLockCount;
  LONG lLocalSynchLockCount;
  DWORD dwWaitState;
  CProcProcessLocalData *pProcLocalData;
  CPalSynchronizationManager *pSynchManager;
  bool fSynchDataRefd;
  bool fEarlyDeath;
  bool fSharedObject;
  DWORD *pdwWaitState;
  ThreadWaitInfo *ptwiWaitInfo;
  SHMPTR shridNewNode;
  WaitingThreadsListNode *pwtlnNewNode;
  PAL_ERROR palErr;
  bool fAlertable_local;
  DWORD dwIndex_local;
  WaitType wtWaitType_local;
  CSynchWaitController *this_local;
  
  pwtlnNewNode._0_4_ = 0;
  ptwiWaitInfo = (ThreadWaitInfo *)0x0;
  fHaveSharedLock = (this->super_CSynchControllerBase).m_odObjectDomain == SharedObject;
  bVar3 = false;
  bVar2 = false;
  this_00 = CPalSynchronizationManager::GetInstance();
  pCVar7 = InternalGetCurrentThread();
  if (pCVar7 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x115);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  ptwiWaitInfo_00 =
       CPalSynchronizationManager::GetThreadWaitInfo((this->super_CSynchControllerBase).m_pthrOwner)
  ;
  if (ptwiWaitInfo_00->pthrOwner != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x11a);
    fprintf(_stderr,"Expression: ptwiWaitInfo->pthrOwner == m_pthrOwner\n");
  }
  Destination = (LONG *)SHMPtrToPtr((((this->super_CSynchControllerBase).m_pthrOwner)->
                                    synchronizationInfo).m_shridWaitAwakened);
  if (fHaveSharedLock) {
    ptwiWaitInfo = (ThreadWaitInfo *)
                   CPalSynchronizationManager::CacheGetSharedWTListNode
                             (this_00,(this->super_CSynchControllerBase).m_pthrOwner);
    shridNewNode = (SHMPTR)SHMPtrToPtr((SHMPTR)ptwiWaitInfo);
  }
  else {
    shridNewNode = (SHMPTR)CPalSynchronizationManager::CacheGetLocalWTListNode
                                     (this_00,(this->super_CSynchControllerBase).m_pthrOwner);
  }
  if (shridNewNode == 0) {
    if ((fHaveSharedLock) && (ptwiWaitInfo != (ThreadWaitInfo *)0x0)) {
      fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x12d);
      fprintf(_stderr,"Bad Shared Memory ptr %p\n",ptwiWaitInfo);
      pwtlnNewNode._0_4_ = 0x54f;
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pwtlnNewNode._0_4_ = 8;
    }
  }
  else if (ptwiWaitInfo_00->lObjCount < 0x40) {
    if (ptwiWaitInfo_00->lObjCount == 0) {
      ptwiWaitInfo_00->wtWaitType = wtWaitType;
      ptwiWaitInfo_00->wdWaitDomain = (this->super_CSynchControllerBase).m_wdWaitDomain;
    }
    else {
      if (wtWaitType != ptwiWaitInfo_00->wtWaitType) {
        fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x147);
        fprintf(_stderr,
                "Expression: wtWaitType == ptwiWaitInfo->wtWaitType, Description: Conflicting wait types in wait registration\n"
               );
      }
      if ((this->super_CSynchControllerBase).m_wdWaitDomain != ptwiWaitInfo_00->wdWaitDomain) {
        ptwiWaitInfo_00->wdWaitDomain = MixedWait;
      }
    }
    *(undefined8 *)(shridNewNode + 0x10) = 0;
    *(ThreadWaitInfo **)(shridNewNode + 0x38) = ptwiWaitInfo_00;
    *(DWORD *)(shridNewNode + 0x20) = dwIndex;
    *(DWORD *)(shridNewNode + 0x1c) = gPID;
    SVar8 = CPalThread::GetThreadId((this->super_CSynchControllerBase).m_pthrOwner);
    *(int *)(shridNewNode + 0x18) = (int)SVar8;
    uVar1 = 0;
    if (wtWaitType == MultipleObjectsWaitAll) {
      uVar1 = 2;
    }
    *(undefined4 *)(shridNewNode + 0x24) = uVar1;
    *(SHMPTR *)(shridNewNode + 0x28) =
         (((this->super_CSynchControllerBase).m_pthrOwner)->synchronizationInfo).m_shridWaitAwakened
    ;
    if (fHaveSharedLock) {
      *(uint *)(shridNewNode + 0x24) = *(uint *)(shridNewNode + 0x24) | 1;
      *(ThreadWaitInfo **)(shridNewNode + 0x10) = ptwiWaitInfo;
      SVar9 = CSynchData::GetSharedThis((this->super_CSynchControllerBase).m_psdSynchData);
      *(SHMPTR *)(shridNewNode + 0x30) = SVar9;
    }
    else {
      *(CSynchData **)(shridNewNode + 0x30) = (this->super_CSynchControllerBase).m_psdSynchData;
    }
    CSynchData::AddRef((this->super_CSynchControllerBase).m_psdSynchData);
    bVar2 = true;
    ptwiWaitInfo_00->rgpWTLNodes[ptwiWaitInfo_00->lObjCount] = (PWaitingThreadsListNode)shridNewNode
    ;
    PVar4 = CSynchData::GetObjectTypeId((this->super_CSynchControllerBase).m_psdSynchData);
    if (PVar4 == otiProcess) {
      pProcLocalData_00 = GetProcessLocalData(this);
      if (pProcLocalData_00 == (CProcProcessLocalData *)0x0) {
        fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x172);
        fprintf(_stderr,"Process synch data pointer is missing\n");
        pwtlnNewNode._0_4_ = 0x54f;
        goto LAB_003bb692;
      }
      pwtlnNewNode._0_4_ =
           CPalSynchronizationManager::RegisterProcessForMonitoring
                     (this_00,(this->super_CSynchControllerBase).m_pthrOwner,
                      (this->super_CSynchControllerBase).m_psdSynchData,pProcLocalData_00);
      if ((PAL_ERROR)pwtlnNewNode != 0) goto LAB_003bb692;
    }
    if (ptwiWaitInfo_00->lObjCount == 0) {
      LVar6 = 1;
      if (fAlertable) {
        LVar6 = 2;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      uVar5 = InterlockedCompareExchange(Destination,LVar6,0);
      if (uVar5 != 0) {
        if (uVar5 == 3) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          bVar3 = true;
          pwtlnNewNode._0_4_ = 0xffffffff;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x19a);
          fprintf(_stderr,"Unexpected thread wait state %d\n",(ulong)uVar5);
          pwtlnNewNode._0_4_ = 0x54f;
        }
        goto LAB_003bb692;
      }
    }
    if (fHaveSharedLock) {
      CSynchData::SharedWaiterEnqueue
                ((this->super_CSynchControllerBase).m_psdSynchData,(SHMPTR)ptwiWaitInfo);
      ptwiWaitInfo_00->lSharedObjCount = ptwiWaitInfo_00->lSharedObjCount + 1;
    }
    else {
      CSynchData::WaiterEnqueue
                ((this->super_CSynchControllerBase).m_psdSynchData,
                 (WaitingThreadsListNode *)shridNewNode);
    }
    ptwiWaitInfo_00->lObjCount = ptwiWaitInfo_00->lObjCount + 1;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x13a);
    fprintf(_stderr,"Too many objects");
    pwtlnNewNode._0_4_ = 0x54f;
  }
LAB_003bb692:
  if ((PAL_ERROR)pwtlnNewNode != 0) {
    CPalSynchronizationManager::UnRegisterWait
              (this_00,(this->super_CSynchControllerBase).m_pthrOwner,ptwiWaitInfo_00,
               fHaveSharedLock);
    if (bVar2) {
      CSynchData::Release((this->super_CSynchControllerBase).m_psdSynchData,
                          (this->super_CSynchControllerBase).m_pthrOwner);
    }
    if ((fHaveSharedLock) && (ptwiWaitInfo != (ThreadWaitInfo *)0x0)) {
      CPalSynchronizationManager::CacheAddSharedWTListNode
                (this_00,(this->super_CSynchControllerBase).m_pthrOwner,(SHMPTR)ptwiWaitInfo);
    }
    else if (shridNewNode != 0) {
      CPalSynchronizationManager::CacheAddLocalWTListNode
                (this_00,(this->super_CSynchControllerBase).m_pthrOwner,
                 (WaitingThreadsListNode *)shridNewNode);
    }
    if (bVar3) {
      CPalSynchronizationManager::ResetSharedSynchLock
                ((this->super_CSynchControllerBase).m_pthrOwner);
      LVar6 = CPalSynchronizationManager::ResetLocalSynchLock
                        ((this->super_CSynchControllerBase).m_pthrOwner);
      if (LVar6 < 1) {
        fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x1cd);
        fprintf(_stderr,"Expression: 0 < lLocalSynchLockCount\n");
      }
      CPalSynchronizationManager::ThreadPrepareForShutdown();
    }
  }
  return (PAL_ERROR)pwtlnNewNode;
}

Assistant:

PAL_ERROR CSynchWaitController::RegisterWaitingThread(
        WaitType wtWaitType,
        DWORD dwIndex,
        bool fAlertable)
    {
        VALIDATEOBJECT(m_psdSynchData);
        
        PAL_ERROR palErr = NO_ERROR;
        WaitingThreadsListNode * pwtlnNewNode = NULL;
        SharedID shridNewNode = NULLSharedID;
        ThreadWaitInfo * ptwiWaitInfo; 
        DWORD * pdwWaitState;
        bool fSharedObject = (SharedObject == m_odObjectDomain);
        bool fEarlyDeath = false;
        bool fSynchDataRefd = false;
        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        
        ptwiWaitInfo = CPalSynchronizationManager::GetThreadWaitInfo(
            m_pthrOwner);

        _ASSERTE(ptwiWaitInfo->pthrOwner == m_pthrOwner);
        
        pdwWaitState = SharedIDToTypePointer(DWORD,
                m_pthrOwner->synchronizationInfo.m_shridWaitAwakened);

        if (fSharedObject)
        {
            shridNewNode = pSynchManager->CacheGetSharedWTListNode(m_pthrOwner);
            pwtlnNewNode = SharedIDToTypePointer(WaitingThreadsListNode, shridNewNode);
        }
        else
        {
            pwtlnNewNode = pSynchManager->CacheGetLocalWTListNode(m_pthrOwner);
        }
        
        if (!pwtlnNewNode)
        {
            if (fSharedObject && (NULLSharedID != shridNewNode))
            {
                ASSERT("Bad Shared Memory ptr %p\n", shridNewNode);
                palErr = ERROR_INTERNAL_ERROR;
            }        
            else
            {
                ERROR("Out of memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
            goto RWT_exit;        
        }

        if (ptwiWaitInfo->lObjCount >= MAXIMUM_WAIT_OBJECTS)
        {
            ASSERT("Too many objects");
            palErr = ERROR_INTERNAL_ERROR; 
            goto RWT_exit;
        }       

        if (0 == ptwiWaitInfo->lObjCount)
        {
            ptwiWaitInfo->wtWaitType = wtWaitType;
            ptwiWaitInfo->wdWaitDomain = m_wdWaitDomain;
        } 
        else 
        {
            _ASSERT_MSG(wtWaitType == ptwiWaitInfo->wtWaitType,
                        "Conflicting wait types in wait registration\n");
            
            if (m_wdWaitDomain != ptwiWaitInfo->wdWaitDomain)
            {
                ptwiWaitInfo->wdWaitDomain = MixedWait;
            }
        }
        
        pwtlnNewNode->shridSHRThis       = NULLSharedID;
        pwtlnNewNode->ptwiWaitInfo       = ptwiWaitInfo;
        pwtlnNewNode->dwObjIndex         = dwIndex;
        pwtlnNewNode->dwProcessId        = gPID;
        pwtlnNewNode->dwThreadId         = m_pthrOwner->GetThreadId();
        pwtlnNewNode->dwFlags            = (MultipleObjectsWaitAll == wtWaitType) ? 
                                            WTLN_FLAG_WAIT_ALL : 0;
        pwtlnNewNode->shridWaitingState  = m_pthrOwner->synchronizationInfo.m_shridWaitAwakened; 
        if (fSharedObject)
        {
            pwtlnNewNode->dwFlags                   |= WTLN_FLAG_OWNER_OBJECT_IS_SHARED;
            pwtlnNewNode->shridSHRThis               = shridNewNode;
            pwtlnNewNode->ptrOwnerObjSynchData.shrid = m_psdSynchData->GetSharedThis();
        }
        else
        {
            pwtlnNewNode->ptrOwnerObjSynchData.ptr = m_psdSynchData;
        }
        
        // AddRef the synch data (will be released in UnregisterWait)
        m_psdSynchData->AddRef();
        fSynchDataRefd = true;

        ptwiWaitInfo->rgpWTLNodes[ptwiWaitInfo->lObjCount] = pwtlnNewNode;

        if(otiProcess == m_psdSynchData->GetObjectTypeId())
        {
            CProcProcessLocalData * pProcLocalData = GetProcessLocalData();

            if (NULL == pProcLocalData)
            {
                // Process local data pointer not set in the controller.
                // This pointer is set in CSynchWaitController only when the
                // wait controller for the object is created by calling
                // GetSynchWaitControllersForObjects
                ASSERT("Process synch data pointer is missing\n");
                palErr = ERROR_INTERNAL_ERROR;
                goto RWT_exit;
            }
            
            palErr = pSynchManager->RegisterProcessForMonitoring(m_pthrOwner,
                                                                 m_psdSynchData, 
                                                                 pProcLocalData);            
            if (NO_ERROR != palErr)
            {
                goto RWT_exit;
            }
        }
        
        if (0 == ptwiWaitInfo->lObjCount)
        {
            DWORD dwWaitState;

            // Setting the thread in wait state 
            dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE: TWS_WAITING);

            TRACE("Switching my wait state [%p] from TWS_ACTIVE to %u \n", 
                  pdwWaitState, dwWaitState);

            dwWaitState = InterlockedCompareExchange(
                (LONG *)pdwWaitState, (LONG)dwWaitState, TWS_ACTIVE);
            if ((DWORD)TWS_ACTIVE != dwWaitState)
            {
                if ((DWORD)TWS_EARLYDEATH == dwWaitState)
                {
                    // Process is terminating, this thread will soon be 
                    // suspended (by SuspendOtherThreads).
                    WARN("Thread is about to get suspended by "
                         "TerminateProcess\n");

                    fEarlyDeath = true;
                    palErr = WAIT_FAILED;
                }
                else
                {
                    ASSERT("Unexpected thread wait state %d\n", dwWaitState);
                    palErr = ERROR_INTERNAL_ERROR;
                }
                goto RWT_exit;
            }
        }

        // Add new node to queue
        if (fSharedObject)
        {
            m_psdSynchData->SharedWaiterEnqueue(shridNewNode);
            ptwiWaitInfo->lSharedObjCount += 1;
        }
        else
        {
            m_psdSynchData->WaiterEnqueue(pwtlnNewNode);
        }

        // Succeeded: update object count
        ptwiWaitInfo->lObjCount++;

    RWT_exit:
        if (palErr != NO_ERROR)
        {
            // Unregister any partial wait registration
            pSynchManager->UnRegisterWait(m_pthrOwner, ptwiWaitInfo, fSharedObject);
            
            if (fSynchDataRefd)
            {
                m_psdSynchData->Release(m_pthrOwner);
            }
            if ((fSharedObject)  && (NULLSharedID != shridNewNode))
            {
                pSynchManager->CacheAddSharedWTListNode(m_pthrOwner, shridNewNode);
            }
            else if (NULL != pwtlnNewNode)
            {
                pSynchManager->CacheAddLocalWTListNode(m_pthrOwner, pwtlnNewNode);
            }

            if (fEarlyDeath)
            {
                // Early death detected, i.e. the process is about to exit. 
                // We need to completely release the synch lock(s) before
                // going to sleep
                LONG lLocalSynchLockCount; 
                LONG lSharedSynchLockCount;
                                          
                lSharedSynchLockCount = CPalSynchronizationManager::ResetSharedSynchLock(m_pthrOwner);
                lLocalSynchLockCount = CPalSynchronizationManager::ResetLocalSynchLock(m_pthrOwner);

                _ASSERTE(0 < lLocalSynchLockCount);

                // Sleep for ever                
                CPalSynchronizationManager::ThreadPrepareForShutdown();
            }
        }
#ifdef SYNCH_STATISTICS
        else
        {
            m_psdSynchData->IncrementStatWaitCount();
            m_psdSynchData->IncrementStatContentionCount();
        }
#endif        
        return palErr;
    }